

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O1

void lws_vhost_bind_wsi(lws_vhost *vh,lws *wsi)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  
  if (wsi->vhost != vh) {
    wsi->vhost = vh;
    iVar1 = vh->count_bound_wsi + 1;
    vh->count_bound_wsi = iVar1;
    pcVar3 = "none";
    pcVar2 = "none";
    if (wsi->role_ops != (lws_role_ops *)0x0) {
      pcVar2 = wsi->role_ops->name;
    }
    if (wsi->protocol != (lws_protocols *)0x0) {
      pcVar3 = wsi->protocol->name;
    }
    _lws_log(0x10,"%s: vh %s: wsi %s/%s, count_bound_wsi %d\n","lws_vhost_bind_wsi",vh->name,pcVar2,
             pcVar3,iVar1);
    if (wsi->vhost->count_bound_wsi < 1) {
      __assert_fail("wsi->vhost->count_bound_wsi > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core-net/wsi.c"
                    ,0x3b,"void lws_vhost_bind_wsi(struct lws_vhost *, struct lws *)");
    }
  }
  return;
}

Assistant:

void
lws_vhost_bind_wsi(struct lws_vhost *vh, struct lws *wsi)
{
	if (wsi->vhost == vh)
		return;
	lws_context_lock(vh->context, __func__); /* ---------- context { */
	wsi->vhost = vh;
	vh->count_bound_wsi++;
	lws_context_unlock(vh->context); /* } context ---------- */
	lwsl_debug("%s: vh %s: wsi %s/%s, count_bound_wsi %d\n", __func__,
		   vh->name, wsi->role_ops ? wsi->role_ops->name : "none",
		   wsi->protocol ? wsi->protocol->name : "none",
		   vh->count_bound_wsi);
	assert(wsi->vhost->count_bound_wsi > 0);
}